

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MeanVarianceNormalizeLayerParams::SharedDtor
          (MeanVarianceNormalizeLayerParams *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  LogMessage *other;
  LogFinisher local_41;
  LogMessage local_40;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 != (undefined8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x842e);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_40,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_41,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_40);
  }
  return;
}

Assistant:

~ActivationPReLUDefaultTypeInternal() {}